

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O3

Id __thiscall spv::Builder::getImageType(Builder *this,Id resultId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  uint uVar3;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[resultId];
  if (pIVar2 == (Instruction *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = pIVar2->typeId;
  }
  pIVar2 = ppIVar1[uVar3];
  if (pIVar2->opCode != OpTypeImage) {
    if (pIVar2->opCode != OpTypeSampledImage) {
      __assert_fail("isImageType(typeId) || isSampledImageType(typeId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                    ,0x172,"Id spv::Builder::getImageType(Id) const");
    }
    if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) {
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    uVar3 = *(pIVar2->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return uVar3;
}

Assistant:

Id getImageType(Id resultId) const
    {
        Id typeId = getTypeId(resultId);
        assert(isImageType(typeId) || isSampledImageType(typeId));
        return isSampledImageType(typeId) ? module.getInstruction(typeId)->getIdOperand(0) : typeId;
    }